

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode client_unencode_write(connectdata *conn,contenc_writer *writer,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  
  if ((nbytes != 0) && ((conn->data->req).ignorebody == false)) {
    CVar1 = Curl_client_write(conn,1,buf,nbytes);
    return CVar1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode client_unencode_write(struct connectdata *conn,
                                      contenc_writer *writer,
                                      const char *buf, size_t nbytes)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  (void) writer;

  if(!nbytes || k->ignorebody)
    return CURLE_OK;

  return Curl_client_write(conn, CLIENTWRITE_BODY, (char *) buf, nbytes);
}